

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x86regalloc.cpp
# Opt level: O3

Error __thiscall asmjit::X86CallAlloc::run(X86CallAlloc *this,CCFuncCall *node)

{
  X86RegCount *pXVar1;
  byte *pbVar2;
  ZoneHeap *pZVar3;
  X86RegMask *pXVar4;
  TiedReg *pTVar5;
  uint8_t *puVar6;
  uint32_t *puVar7;
  Zone *pZVar8;
  VirtReg *pVVar9;
  VirtReg *srcReg;
  TiedReg *pTVar10;
  CBNode *pCVar11;
  CodeEmitter *this_00;
  X86Compiler *pXVar12;
  long lVar13;
  CCFuncCall *pCVar14;
  uint uVar15;
  byte bVar16;
  byte bVar17;
  ushort uVar18;
  ushort uVar19;
  TiedReg *pTVar20;
  X86RAData *pXVar21;
  char **ppcVar22;
  bool bVar23;
  uint8_t uVar24;
  uint32_t dstId;
  uint32_t extraout_EDX;
  long lVar25;
  X86RAPass *pXVar26;
  ulong uVar28;
  ulong uVar29;
  uint uVar30;
  byte bVar31;
  uint uVar32;
  uint uVar33;
  uint uVar34;
  uint uVar35;
  uint16_t uVar36;
  uint uVar37;
  uint32_t uVar38;
  uint uVar39;
  X86RAPass *unaff_R12;
  int iVar40;
  X86RAState *pXVar41;
  VirtReg **ppVVar42;
  ulong uVar43;
  X86RAPass *pXVar44;
  char cVar45;
  X86RAPass *unaff_R14;
  char *pcVar46;
  uint uVar47;
  bool bVar48;
  bool bVar49;
  anon_union_16_7_ed616b9d_for_Operand__0 local_50;
  CCFuncCall *local_40;
  X86RAPass *local_38;
  X86RAPass *pXVar27;
  
  pXVar21 = (X86RAData *)(node->super_CBInst).super_CBNode._passData;
  (this->super_X86BaseAlloc)._node = (CBNode *)node;
  (this->super_X86BaseAlloc)._raData = pXVar21;
  (((this->super_X86BaseAlloc)._cc)->super_CodeCompiler).super_CodeBuilder._cursor =
       (node->super_CBInst).super_CBNode._prev;
  pTVar20 = pXVar21->tiedArray;
  (this->super_X86BaseAlloc)._tiedArray[0] = pTVar20;
  (this->super_X86BaseAlloc)._tiedArray[2] =
       pXVar21->tiedArray + (pXVar21->tiedIndex).field_0.field_0._mm;
  (this->super_X86BaseAlloc)._tiedArray[3] =
       pXVar21->tiedArray + (pXVar21->tiedIndex).field_0.field_0._k;
  (this->super_X86BaseAlloc)._tiedArray[1] =
       pXVar21->tiedArray + (pXVar21->tiedIndex).field_0.field_0._vec;
  uVar39 = (pXVar21->super_RAData).tiedTotal;
  (this->super_X86BaseAlloc)._tiedTotal = uVar39;
  uVar38 = (pXVar21->tiedCount).field_0._packed;
  (this->super_X86BaseAlloc)._tiedCount.field_0._packed = uVar38;
  (this->super_X86BaseAlloc)._tiedDone.field_0._packed = 0;
  if ((ulong)uVar39 != 0) {
    lVar25 = 0;
    do {
      pTVar20 = (this->super_X86BaseAlloc)._tiedArray[0];
      *(long *)(*(long *)((long)&pTVar20->vreg + lVar25) + 0x30) = (long)&pTVar20->vreg + lVar25;
      lVar25 = lVar25 + 0x18;
    } while ((ulong)uVar39 * 0x18 != lVar25);
    pTVar20 = (this->super_X86BaseAlloc)._tiedArray[0];
    uVar38 = (uint32_t)(this->super_X86BaseAlloc)._tiedCount.field_0.field_0._gp;
  }
  uVar36 = 0;
  (this->_willAlloc).field_0 = (anon_union_8_2_a70401ef_for_X86RegMask_0)0x0;
  uVar39 = (node->_funcDetail)._usedRegs[0];
  uVar30 = uVar39 & 0xffff;
  (this->_willAlloc).field_0.field_0._gp = (uint16_t)uVar39;
  (this->_willAlloc).field_0.field_0._mm = (uint8_t)(node->_funcDetail)._usedRegs[2];
  (this->_willAlloc).field_0.field_0._k = (uint8_t)(node->_funcDetail)._usedRegs[3];
  (this->_willAlloc).field_0.field_0._vec = (node->_funcDetail)._usedRegs[1];
  (this->_willSpill).field_0 = (anon_union_8_2_a70401ef_for_X86RegMask_0)0x0;
  uVar39 = uVar38 & 0xff;
  local_40 = node;
  if (uVar39 != 0) {
    pXVar27 = (this->super_X86BaseAlloc)._context;
    uVar47 = (uint)(pXVar21->clobberedRegs).field_0.field_0._gp;
    uVar35 = ~uVar30 & uVar47;
    uVar47 = ~uVar47;
    lVar25 = 0;
    do {
      uVar37 = *(uint *)((long)&pTVar20->flags + lVar25);
      bVar31 = *(byte *)(*(long *)((long)&pTVar20->vreg + lVar25) + 0x25);
      if (bVar31 == 0xff) {
        uVar32 = 0;
        if ((uVar37 & 1) != 0) goto LAB_0012de38;
        *(uint *)((long)&pTVar20->flags + lVar25) = uVar37 | 0x400000;
        if ((this->super_X86BaseAlloc)._tiedDone.field_0.field_0._gp == 0xff) goto LAB_00130024;
LAB_0012de74:
        pXVar1 = &(this->super_X86BaseAlloc)._tiedDone;
        (pXVar1->field_0)._packed = (pXVar1->field_0)._packed + 1;
      }
      else {
        if (0x1f < bVar31) goto LAB_0012fed0;
        uVar32 = 1 << (bVar31 & 0x1f);
        if ((uVar37 & 1) != 0) {
LAB_0012de38:
          uVar33 = *(uint *)((long)&pTVar20->inRegs + lVar25);
          if (uVar33 == 0) {
            uVar33 = *(uint *)((long)&pTVar20->allocableRegs + lVar25);
          }
          if (((uVar33 & uVar32) != 0) || (((uVar32 & uVar47) != 0 && ((uVar37 & 0x1000) == 0)))) {
            *(byte *)((long)&pTVar20->field_2 + lVar25 + 1) = bVar31;
            *(uint *)((long)&pTVar20->flags + lVar25) = uVar37 | 0x400000;
            if ((this->super_X86BaseAlloc)._tiedDone.field_0.field_0._gp != 0xff) goto LAB_0012de74;
            goto LAB_0012ff16;
          }
        }
        uVar35 = uVar35 | uVar32;
      }
      lVar25 = lVar25 + 0x18;
    } while ((ulong)(uVar39 * 8) * 3 != lVar25);
    uVar37 = 0;
    uVar36 = 0;
    if (uVar39 != 0) {
      uVar35 = ~uVar35 & (uint)(pXVar27->_x86State)._occupied.field_0.field_0._gp;
      uVar28 = 0;
      do {
        if ((pTVar20[uVar28].flags & 0x400001) == 1) {
          unaff_R14 = (X86RAPass *)(pTVar20 + uVar28);
          uVar32 = *(uint *)&(unaff_R14->super_RAPass).super_CBPass._name;
          if (uVar32 == 0) {
            uVar32 = ~uVar30 & *(uint *)((long)&(unaff_R14->super_RAPass).super_CBPass._name + 4);
            if (uVar32 == 0) goto LAB_00130065;
            if ((uVar32 & uVar32 - 1) != 0) {
              unaff_R12 = (X86RAPass *)(this->super_X86BaseAlloc)._node;
              iVar40 = 0;
              uVar33 = uVar32;
              do {
                pcVar46 = (unaff_R12->super_RAPass).super_CBPass._name;
                uVar15 = uVar32;
                if ((((ulong)pcVar46 & 0xa00000) != 0) ||
                   ((((ulong)pcVar46 & 0x100000) != 0 &&
                    (unaff_R12 = (X86RAPass *)(unaff_R12->super_RAPass)._heap._slots[4],
                    unaff_R12 == (X86RAPass *)0x0)))) break;
                unaff_R12 = (X86RAPass *)(unaff_R12->super_RAPass).super_CBPass._cb;
                if (unaff_R12 == (X86RAPass *)0x0) goto LAB_0012fedf;
                pZVar8 = (unaff_R12->super_RAPass)._heap._zone;
                uVar34 = uVar33;
                if (pZVar8 != (Zone *)0x0) {
                  bVar31 = *(byte *)((long)&pZVar8[1]._block + 4);
                  uVar15 = uVar33;
                  if (bVar31 != 0) {
                    lVar25 = 0;
                    do {
                      if (*(VirtReg **)
                           ((long)&pZVar8[1]._blockSize +
                           lVar25 + (ulong)*(byte *)&pZVar8[1]._block * 0x18) ==
                          pTVar20[uVar28].vreg) {
                        uVar32 = *(uint *)((long)&pZVar8[2]._end +
                                          lVar25 + (ulong)*(byte *)&pZVar8[1]._block * 0x18);
                        if (uVar32 != 0) {
                          uVar32 = uVar32 & uVar33;
                          if (uVar32 == 0) goto LAB_0012dfc5;
                          goto LAB_0012dfcf;
                        }
                        break;
                      }
                      lVar25 = lVar25 + 0x18;
                    } while ((ulong)bVar31 * 0x18 != lVar25);
                  }
                  uVar34 = ~(uint)(ushort)(*(ushort *)&pZVar8[1]._end |
                                          *(ushort *)&pZVar8[1]._ptr | (ushort)pZVar8->_blockSize) &
                           uVar33;
                  uVar32 = uVar33;
                  if (uVar34 == 0) break;
                }
                uVar33 = uVar34;
                iVar40 = iVar40 + 1;
                uVar15 = uVar32;
              } while (iVar40 != 0x40);
LAB_0012dfc5:
              uVar32 = uVar15;
              if (uVar32 == 0) goto LAB_0012ff98;
            }
LAB_0012dfcf:
            uVar33 = ~uVar35 & uVar32;
            if (((~uVar35 & uVar32) == 0) &&
               (uVar33 = uVar35 & uVar32 & ~(uint)(pXVar27->_x86State)._modified.field_0.field_0._gp
               , uVar33 == 0)) {
              uVar33 = uVar32;
            }
            uVar32 = uVar33 & uVar47;
            if (uVar32 == 0) {
              uVar32 = uVar33;
            }
            if ((pTVar20[uVar28].flags & 0x1002) != 0) {
              uVar32 = uVar33;
            }
            uVar33 = 0;
            if (uVar32 != 0) {
              for (; (uVar32 >> uVar33 & 1) == 0; uVar33 = uVar33 + 1) {
              }
            }
            if (uVar32 == 0) {
              uVar33 = 0xffffffff;
            }
            if (0x1f < uVar33) goto LAB_0013006a;
            uVar32 = 1 << ((byte)uVar33 & 0x1f);
            *(byte *)((long)&(unaff_R14->super_RAPass).super_CBPass._cb + 5) = (byte)uVar33;
            *(uint *)&(unaff_R14->super_RAPass).super_CBPass._name = uVar32;
            uVar30 = uVar30 | 1 << (uVar33 & 0x1f);
            uVar33 = uVar35 | 1 << (uVar33 & 0x1f);
          }
          else {
            iVar40 = 0;
            if (uVar32 != 0) {
              for (; (uVar32 >> iVar40 & 1) == 0; iVar40 = iVar40 + 1) {
              }
            }
            *(char *)((long)&(unaff_R14->super_RAPass).super_CBPass._cb + 5) = (char)iVar40;
            uVar33 = uVar35;
          }
          uVar37 = uVar37 | uVar32 & uVar35;
          uVar35 = uVar33;
        }
        uVar36 = (uint16_t)uVar37;
        uVar28 = uVar28 + 1;
      } while (uVar28 != uVar39);
    }
  }
  (this->_willSpill).field_0.field_0._gp = uVar36;
  (this->_willAlloc).field_0.field_0._gp = (uint16_t)uVar30;
  bVar31 = (this->_willAlloc).field_0.field_0._mm;
  bVar16 = (this->super_X86BaseAlloc)._tiedCount.field_0.field_0._mm;
  uVar39 = 0;
  if (bVar16 == 0) {
    uVar24 = '\0';
  }
  else {
    pXVar27 = (this->super_X86BaseAlloc)._context;
    pTVar20 = (this->super_X86BaseAlloc)._tiedArray[2];
    uVar35 = (uint)(((this->super_X86BaseAlloc)._raData)->clobberedRegs).field_0.field_0._mm;
    uVar30 = ~(uint)bVar31 & uVar35;
    lVar25 = 0;
    do {
      uVar47 = *(uint *)((long)&pTVar20->flags + lVar25);
      bVar17 = *(byte *)(*(long *)((long)&pTVar20->vreg + lVar25) + 0x25);
      if (bVar17 == 0xff) {
        unaff_R14 = (X86RAPass *)0x0;
        if ((uVar47 & 1) != 0) goto LAB_0012e0fc;
        *(uint *)((long)&pTVar20->flags + lVar25) = uVar47 | 0x400000;
        if ((this->super_X86BaseAlloc)._tiedDone.field_0.field_0._mm == 0xff) goto LAB_00130029;
LAB_0012e13a:
        pXVar1 = &(this->super_X86BaseAlloc)._tiedDone;
        (pXVar1->field_0)._packed = (pXVar1->field_0)._packed + 0x10000;
      }
      else {
        if (0x1f < bVar17) goto LAB_0012fed5;
        unaff_R14 = (X86RAPass *)(ulong)(uint)(1 << (bVar17 & 0x1f));
        if ((uVar47 & 1) != 0) {
LAB_0012e0fc:
          uVar37 = *(uint *)((long)&pTVar20->inRegs + lVar25);
          if (uVar37 == 0) {
            uVar37 = *(uint *)((long)&pTVar20->allocableRegs + lVar25);
          }
          if (((uVar37 & (uint)unaff_R14) != 0) ||
             ((((uint)unaff_R14 & ~uVar35) != 0 && ((uVar47 & 0x1000) == 0)))) {
            *(byte *)((long)&pTVar20->field_2 + lVar25 + 1) = bVar17;
            *(uint *)((long)&pTVar20->flags + lVar25) = uVar47 | 0x400000;
            if ((this->super_X86BaseAlloc)._tiedDone.field_0.field_0._mm != 0xff) goto LAB_0012e13a;
            goto LAB_0012ff34;
          }
        }
        uVar30 = uVar30 | (uint)unaff_R14;
      }
      lVar25 = lVar25 + 0x18;
    } while ((ulong)((uint)bVar16 * 8) * 3 != lVar25);
    uVar35 = 0;
    uVar24 = '\0';
    if (bVar16 != 0) {
      bVar17 = (pXVar27->_x86State)._occupied.field_0.field_0._mm;
      lVar25 = 0;
      do {
        if ((*(uint *)((long)&pTVar20->flags + lVar25) & 0x400001) == 1) {
          uVar47 = *(uint *)((long)&pTVar20->inRegs + lVar25);
          if (uVar47 == 0) goto LAB_0012ff8e;
          iVar40 = 0;
          if (uVar47 != 0) {
            for (; (uVar47 >> iVar40 & 1) == 0; iVar40 = iVar40 + 1) {
            }
          }
          *(char *)((long)&pTVar20->field_2 + lVar25 + 1) = (char)iVar40;
          uVar35 = uVar35 | uVar47 & ~uVar30 & (uint)bVar17;
        }
        uVar24 = (uint8_t)uVar35;
        lVar25 = lVar25 + 0x18;
      } while ((ulong)bVar16 * 0x18 != lVar25);
    }
  }
  (this->_willSpill).field_0.field_0._mm = uVar24;
  (this->_willAlloc).field_0.field_0._mm = bVar31;
  uVar30 = (this->_willAlloc).field_0.field_0._vec;
  bVar31 = (this->super_X86BaseAlloc)._tiedCount.field_0.field_0._vec;
  if (bVar31 != 0) {
    pXVar27 = (this->super_X86BaseAlloc)._context;
    pTVar20 = (this->super_X86BaseAlloc)._tiedArray[1];
    uVar39 = (((this->super_X86BaseAlloc)._raData)->clobberedRegs).field_0.field_0._vec;
    uVar35 = ~uVar30 & uVar39;
    lVar25 = 0;
    do {
      uVar47 = *(uint *)((long)&pTVar20->flags + lVar25);
      bVar16 = *(byte *)(*(long *)((long)&pTVar20->vreg + lVar25) + 0x25);
      if (bVar16 == 0xff) {
        uVar37 = 0;
        if ((uVar47 & 1) != 0) goto LAB_0012e23b;
        *(uint *)((long)&pTVar20->flags + lVar25) = uVar47 | 0x400000;
        if ((this->super_X86BaseAlloc)._tiedDone.field_0.field_0._vec == 0xff) goto LAB_0013002e;
LAB_0012e27b:
        pXVar1 = &(this->super_X86BaseAlloc)._tiedDone;
        (pXVar1->field_0)._packed = (pXVar1->field_0)._packed + 0x100;
      }
      else {
        if (0x1f < bVar16) goto LAB_0012feda;
        uVar37 = 1 << (bVar16 & 0x1f);
        if ((uVar47 & 1) != 0) {
LAB_0012e23b:
          uVar32 = *(uint *)((long)&pTVar20->inRegs + lVar25);
          if (uVar32 == 0) {
            uVar32 = *(uint *)((long)&pTVar20->allocableRegs + lVar25);
          }
          unaff_R14 = (X86RAPass *)(ulong)uVar32;
          if (((uVar32 & uVar37) != 0) ||
             (((uVar37 & ~uVar39) != 0 &&
              (unaff_R14 = (X86RAPass *)(ulong)(uVar47 & 0x1000), (uVar47 & 0x1000) == 0)))) {
            *(byte *)((long)&pTVar20->field_2 + lVar25 + 1) = bVar16;
            *(uint *)((long)&pTVar20->flags + lVar25) = uVar47 | 0x400000;
            if ((this->super_X86BaseAlloc)._tiedDone.field_0.field_0._vec != 0xff)
            goto LAB_0012e27b;
            goto LAB_0012ff39;
          }
        }
        uVar35 = uVar35 | uVar37;
      }
      lVar25 = lVar25 + 0x18;
    } while ((ulong)((uint)bVar31 * 8) * 3 != lVar25);
    if (bVar31 == 0) {
      uVar39 = 0;
    }
    else {
      uVar47 = (pXVar27->_x86State)._occupied.field_0.field_0._vec;
      lVar25 = 0;
      uVar39 = 0;
      do {
        if ((*(uint *)((long)&pTVar20->flags + lVar25) & 0x400001) == 1) {
          uVar37 = *(uint *)((long)&pTVar20->inRegs + lVar25);
          if (uVar37 == 0) goto LAB_0012ff93;
          iVar40 = 0;
          if (uVar37 != 0) {
            for (; (uVar37 >> iVar40 & 1) == 0; iVar40 = iVar40 + 1) {
            }
          }
          *(char *)((long)&pTVar20->field_2 + lVar25 + 1) = (char)iVar40;
          uVar39 = uVar39 | uVar37 & ~uVar35 & uVar47;
        }
        lVar25 = lVar25 + 0x18;
      } while ((ulong)bVar31 * 0x18 != lVar25);
    }
  }
  (this->_willSpill).field_0.field_0._vec = uVar39;
  (this->_willAlloc).field_0.field_0._vec = uVar30;
  uVar18 = (this->_willSpill).field_0.field_0._gp;
  if (uVar18 != 0) {
    pXVar27 = (this->super_X86BaseAlloc)._context;
    unaff_R14 = (X86RAPass *)0xffffffff;
    uVar39 = (uint)uVar18;
    do {
      iVar40 = 0;
      if (uVar39 != 0) {
        for (; (uVar39 >> iVar40 & 1) == 0; iVar40 = iVar40 + 1) {
        }
      }
      bVar31 = (char)iVar40 + 1U & 0x1f;
      unaff_R14 = (X86RAPass *)(ulong)((int)unaff_R14 + iVar40 + 1);
      unaff_R12 = (X86RAPass *)(pXVar27->_x86State).field_0._list[(long)unaff_R14];
      if ((unaff_R12 == (X86RAPass *)0x0) ||
         ((TiedReg *)(unaff_R12->super_RAPass)._heap._slots[1] != (TiedReg *)0x0))
      goto LAB_0012feb2;
      uVar30 = ((RegInfo *)((long)&(unaff_R12->super_RAPass).super_CBPass._vptr_CBPass + 4))->
               _signature;
      if ((uVar30 & 0xf00) != 0) goto LAB_0012fec1;
      pXVar44 = (this->super_X86BaseAlloc)._context;
      if (*(uint8_t *)((long)&(unaff_R12->super_RAPass)._heap._zone + 4) == '\x01') {
        bVar16 = *(uint8_t *)((long)&(unaff_R12->super_RAPass)._heap._zone + 5);
        if (bVar16 == 0xff) goto LAB_0012fee4;
        if ((X86RAPass *)(pXVar44->_x86State).field_0._list[bVar16] != unaff_R12) goto LAB_0012fee9;
        if (*(uint8_t *)((long)&(unaff_R12->super_RAPass)._heap._zone + 6) != '\0') {
          X86RAPass::emitSave(pXVar44,(VirtReg *)unaff_R12,(uint)bVar16,"Spill");
          uVar30 = ((RegInfo *)((long)&(unaff_R12->super_RAPass).super_CBPass._vptr_CBPass + 4))->
                   _signature;
        }
        if ((uVar30 & 0xf00) != 0) goto LAB_0012feee;
        if (*(uint8_t *)((long)&(unaff_R12->super_RAPass)._heap._zone + 5) != bVar16)
        goto LAB_0012fef3;
        if (0x1f < bVar16) goto LAB_0012fef8;
        *(undefined2 *)((long)&(unaff_R12->super_RAPass)._heap._zone + 4) = 0xff02;
        *(uint8_t *)((long)&(unaff_R12->super_RAPass)._heap._zone + 6) = '\0';
        uVar18 = (ushort)(-2 << (bVar16 & 0x1f)) | (ushort)(0xfffffffe >> 0x20 - (bVar16 & 0x1f));
        (pXVar44->_x86State).field_0._list[bVar16] = (VirtReg *)0x0;
        pXVar4 = &(pXVar44->_x86State)._occupied;
        (pXVar4->field_0).field_0._gp = (pXVar4->field_0).field_0._gp & uVar18;
        pXVar4 = &(pXVar44->_x86State)._modified;
        (pXVar4->field_0).field_0._gp = (pXVar4->field_0).field_0._gp & uVar18;
        X86RAPass::_checkState(pXVar44);
      }
      X86RAPass::_checkState(pXVar44);
      uVar30 = uVar39 >> bVar31;
      uVar39 = uVar39 >> bVar31;
    } while (uVar30 != 0);
  }
  bVar31 = (this->_willSpill).field_0.field_0._mm;
  if (bVar31 != 0) {
    pXVar27 = (this->super_X86BaseAlloc)._context;
    unaff_R14 = (X86RAPass *)0xffffffff;
    uVar39 = (uint)bVar31;
    do {
      iVar40 = 0;
      if (uVar39 != 0) {
        for (; (uVar39 >> iVar40 & 1) == 0; iVar40 = iVar40 + 1) {
        }
      }
      bVar31 = (char)iVar40 + 1U & 0x1f;
      unaff_R14 = (X86RAPass *)(ulong)((int)unaff_R14 + iVar40 + 1);
      pVVar9 = *(VirtReg **)((long)&(pXVar27->_x86State).field_0 + (long)unaff_R14 * 8 + 0x80);
      if ((pVVar9 == (VirtReg *)0x0) || (pVVar9->_tied != (TiedReg *)0x0)) goto LAB_0012feb7;
      uVar30 = (pVVar9->_regInfo)._signature;
      if ((uVar30 & 0xf00) != 0x200) goto LAB_0012fec6;
      unaff_R12 = (this->super_X86BaseAlloc)._context;
      if (pVVar9->_state == '\x01') {
        bVar16 = pVVar9->_physId;
        if (bVar16 == 0xff) goto LAB_0012fefd;
        if (*(VirtReg **)((long)&(unaff_R12->_x86State).field_0 + (ulong)bVar16 * 8 + 0x80) !=
            pVVar9) goto LAB_0012ff02;
        if (pVVar9->_modified != '\0') {
          X86RAPass::emitSave(unaff_R12,pVVar9,(uint)bVar16,"Spill");
          uVar30 = (pVVar9->_regInfo)._signature;
        }
        if ((uVar30 & 0xf00) != 0x200) goto LAB_0012ff07;
        if (pVVar9->_physId != bVar16) goto LAB_0012ff0c;
        if (0x1f < bVar16) goto LAB_0012ff11;
        pVVar9->_state = '\x02';
        pVVar9->_physId = 0xff;
        pVVar9->_modified = '\0';
        *(undefined8 *)((long)&(unaff_R12->_x86State).field_0 + (ulong)bVar16 * 8 + 0x80) = 0;
        bVar16 = ~(byte)(1 << (bVar16 & 0x1f));
        puVar6 = &(unaff_R12->_x86State)._occupied.field_0.field_0._mm;
        *puVar6 = *puVar6 & bVar16;
        puVar6 = &(unaff_R12->_x86State)._modified.field_0.field_0._mm;
        *puVar6 = *puVar6 & bVar16;
        X86RAPass::_checkState(unaff_R12);
      }
      X86RAPass::_checkState(unaff_R12);
      uVar30 = uVar39 >> bVar31;
      uVar39 = uVar39 >> bVar31;
    } while (uVar30 != 0);
  }
  uVar39 = (this->_willSpill).field_0.field_0._vec;
  if (uVar39 != 0) {
    pXVar27 = (this->super_X86BaseAlloc)._context;
    unaff_R14 = (X86RAPass *)0xffffffff;
    do {
      iVar40 = 0;
      if (uVar39 != 0) {
        for (; (uVar39 >> iVar40 & 1) == 0; iVar40 = iVar40 + 1) {
        }
      }
      uVar39 = uVar39 >> ((char)iVar40 + 1U & 0x1f);
      unaff_R14 = (X86RAPass *)(ulong)((int)unaff_R14 + iVar40 + 1);
      pVVar9 = *(VirtReg **)((long)&(pXVar27->_x86State).field_0 + (long)unaff_R14 * 8 + 0xc0);
      if ((pVVar9 == (VirtReg *)0x0) || (pVVar9->_tied != (TiedReg *)0x0)) goto LAB_0012febc;
      uVar30 = (pVVar9->_regInfo)._signature;
      if ((uVar30 & 0xf00) != 0x100) goto LAB_0012fecb;
      unaff_R12 = (this->super_X86BaseAlloc)._context;
      if (pVVar9->_state == '\x01') {
        bVar31 = pVVar9->_physId;
        if (bVar31 == 0xff) goto LAB_0012ff1b;
        if (*(VirtReg **)((long)&(unaff_R12->_x86State).field_0 + (ulong)bVar31 * 8 + 0xc0) !=
            pVVar9) goto LAB_0012ff20;
        if (pVVar9->_modified != '\0') {
          X86RAPass::emitSave(unaff_R12,pVVar9,(uint)bVar31,"Spill");
          uVar30 = (pVVar9->_regInfo)._signature;
        }
        if ((uVar30 & 0xf00) != 0x100) goto LAB_0012ff25;
        if (pVVar9->_physId != bVar31) goto LAB_0012ff2a;
        if (0x1f < bVar31) goto LAB_0012ff2f;
        pVVar9->_state = '\x02';
        pVVar9->_physId = 0xff;
        pVVar9->_modified = '\0';
        uVar30 = -2 << (bVar31 & 0x1f) | 0xfffffffeU >> 0x20 - (bVar31 & 0x1f);
        *(undefined8 *)((long)&(unaff_R12->_x86State).field_0 + (ulong)bVar31 * 8 + 0xc0) = 0;
        puVar7 = &(unaff_R12->_x86State)._occupied.field_0.field_0._vec;
        *puVar7 = *puVar7 & uVar30;
        puVar7 = &(unaff_R12->_x86State)._modified.field_0.field_0._vec;
        *puVar7 = *puVar7 & uVar30;
        X86RAPass::_checkState(unaff_R12);
      }
      X86RAPass::_checkState(unaff_R12);
    } while (uVar39 != 0);
  }
  uVar39 = (this->super_X86BaseAlloc)._tiedCount.field_0._packed;
  uVar30 = (this->super_X86BaseAlloc)._tiedDone.field_0._packed;
  if (((uVar30 & 0xff) != (uVar39 & 0xff)) && ((uVar39 & 0xff) != 0)) {
    pTVar20 = (this->super_X86BaseAlloc)._tiedArray[0];
    pXVar27 = (X86RAPass *)0x0;
    bVar31 = 0;
    do {
      bVar16 = bVar31;
      if ((pTVar20[(long)pXVar27].flags & 0x400001) == 1) {
        pTVar5 = pTVar20 + (long)pXVar27;
        pVVar9 = pTVar5->vreg;
        bVar31 = pVVar9->_physId;
        unaff_R12 = (X86RAPass *)CONCAT71((int7)((ulong)unaff_R12 >> 8),bVar31);
        bVar16 = (pTVar5->field_2).field_0.inPhysId;
        pcVar46 = (char *)(ulong)bVar16;
        if (bVar31 == bVar16) goto LAB_0013001a;
        pXVar26 = (X86RAPass *)(ulong)bVar16;
        pXVar44 = (this->super_X86BaseAlloc)._context;
        srcReg = (pXVar44->_x86State).field_0._list[(long)pXVar26];
        if (srcReg == (VirtReg *)0x0) {
          uVar30 = (pVVar9->_regInfo)._signature;
          if (bVar31 == 0xff) {
            if ((uVar30 & 0xf00) != 0) goto LAB_00130144;
            if (bVar16 == 0xff) goto LAB_00130149;
            unaff_R14 = (X86RAPass *)pcVar46;
            if (0x1f < bVar16) goto LAB_0013014e;
            uVar30 = 1 << (bVar16 & 0x1f);
            if (pVVar9->_state == '\x02') {
              X86RAPass::emitLoad(pXVar44,pVVar9,(uint)bVar16,"Alloc");
              unaff_R12 = pXVar26;
            }
            else if (pVVar9->_state == '\x01') {
              X86RAPass::emitMove(pXVar44,pVVar9,(uint)bVar16,(uint)bVar31,"Alloc");
              pXVar44[2]._x86State.field_0._list[1] = (VirtReg *)0x0;
              goto LAB_001301e9;
            }
            pVVar9->_modified = '\0';
            pVVar9->_state = '\x01';
            pVVar9->_physId = bVar16;
            pVVar9->_homeMask = pVVar9->_homeMask | uVar30;
            (pXVar44->_x86State).field_0._list[(long)pXVar26] = pVVar9;
            pXVar4 = &(pXVar44->_x86State)._occupied;
            uVar19 = (ushort)uVar30;
            (pXVar4->field_0).field_0._gp = (pXVar4->field_0).field_0._gp ^ uVar19;
            unaff_R14 = (X86RAPass *)0x0;
            uVar18 = uVar19;
            if (pVVar9->_modified == '\0') {
              uVar18 = 0;
            }
            pXVar4 = &(pXVar44->_x86State)._modified;
            (pXVar4->field_0).field_0._gp = (pXVar4->field_0).field_0._gp ^ uVar18;
            X86RAPass::_checkState(pXVar44);
            pXVar4 = &((this->super_X86BaseAlloc)._context)->_clobberedRegs;
            (pXVar4->field_0).field_0._gp = (pXVar4->field_0).field_0._gp | uVar19;
            pbVar2 = (byte *)((long)&pTVar5->flags + 2);
            *pbVar2 = *pbVar2 | 0x40;
            pXVar44 = (X86RAPass *)this;
            if ((this->super_X86BaseAlloc)._tiedDone.field_0.field_0._gp == 0xff) goto LAB_00130153;
          }
          else {
            if ((uVar30 & 0xf00) != 0) goto LAB_001300ab;
            if (pVVar9->_state != '\x01') goto LAB_001300b0;
            local_38 = pXVar26;
            X86RAPass::emitMove(pXVar44,pVVar9,(uint)bVar16,(uint)bVar31,"Move");
            if (((pVVar9->_regInfo)._signature & 0xf00) != 0) goto LAB_001300b5;
            if (0x1f < bVar16) goto LAB_001300ba;
            if (0x1f < bVar31) goto LAB_001300bf;
            uVar18 = (ushort)(1 << (bVar16 & 0x1f));
            uVar19 = uVar18 ^ (ushort)(1 << ((uint)unaff_R12 & 0x1f));
            pVVar9->_physId = bVar16;
            (pXVar44->_x86State).field_0._list[bVar31] = (VirtReg *)0x0;
            (pXVar44->_x86State).field_0._list[(long)local_38] = pVVar9;
            pXVar4 = &(pXVar44->_x86State)._occupied;
            (pXVar4->field_0).field_0._gp = (pXVar4->field_0).field_0._gp ^ uVar19;
            if (pVVar9->_modified == '\0') {
              uVar19 = 0;
            }
            pXVar4 = &(pXVar44->_x86State)._modified;
            (pXVar4->field_0).field_0._gp = (pXVar4->field_0).field_0._gp ^ uVar19;
            X86RAPass::_checkState(pXVar44);
            X86RAPass::_checkState(pXVar44);
            pXVar4 = &((this->super_X86BaseAlloc)._context)->_clobberedRegs;
            (pXVar4->field_0).field_0._gp = (pXVar4->field_0).field_0._gp | uVar18;
            pbVar2 = (byte *)((long)&pTVar5->flags + 2);
            *pbVar2 = *pbVar2 | 0x40;
            unaff_R12 = pXVar44;
            if ((this->super_X86BaseAlloc)._tiedDone.field_0.field_0._gp == 0xff) goto LAB_001300c4;
          }
        }
        else {
          if (pVVar9 == srcReg) goto LAB_0013003d;
          if (((pVVar9->_regInfo)._signature & 0xf00) != 0) goto LAB_00130042;
          if (pVVar9->_state != '\x01') goto LAB_00130047;
          if (bVar31 == 0xff) goto LAB_0013004c;
          if (((srcReg->_regInfo)._signature & 0xf00) != 0) goto LAB_00130051;
          if (srcReg->_state != '\x01') goto LAB_00130056;
          bVar16 = srcReg->_physId;
          if (bVar16 == 0xff) goto LAB_0013005b;
          pTVar10 = srcReg->_tied;
          X86RAPass::emitSwapGp(pXVar44,pVVar9,srcReg,(uint)bVar31,(uint)bVar16,"Swap");
          pVVar9->_physId = bVar16;
          srcReg->_physId = bVar31;
          (pXVar44->_x86State).field_0._list[bVar31] = srcReg;
          (pXVar44->_x86State).field_0._list[bVar16] = pVVar9;
          bVar23 = (srcReg->_modified != '\0') != (pVVar9->_modified != '\0');
          pXVar4 = &(pXVar44->_x86State)._modified;
          (pXVar4->field_0).field_0._gp =
               (pXVar4->field_0).field_0._gp ^
               ((ushort)bVar23 << (bVar16 & 0x1f) | (ushort)bVar23 << (bVar31 & 0x1f));
          X86RAPass::_checkState(pXVar44);
          pbVar2 = (byte *)((long)&pTVar5->flags + 2);
          *pbVar2 = *pbVar2 | 0x40;
          if ((this->super_X86BaseAlloc)._tiedDone.field_0.field_0._gp == 0xff) goto LAB_00130060;
          uVar30 = (this->super_X86BaseAlloc)._tiedDone.field_0._packed + 1;
          (this->super_X86BaseAlloc)._tiedDone.field_0._packed = uVar30;
          bVar16 = 1;
          if ((pTVar10 == (TiedReg *)0x0) || (bVar31 != (pTVar10->field_2).field_0.inPhysId))
          goto LAB_0012ea03;
          pbVar2 = (byte *)((long)&pTVar10->flags + 2);
          *pbVar2 = *pbVar2 | 0x40;
          if ((this->super_X86BaseAlloc)._tiedDone.field_0.field_0._gp == 0xff) goto LAB_001300c9;
        }
        uVar30 = (this->super_X86BaseAlloc)._tiedDone.field_0._packed + 1;
        (this->super_X86BaseAlloc)._tiedDone.field_0._packed = uVar30;
        bVar16 = 1;
      }
LAB_0012ea03:
      unaff_R14 = (X86RAPass *)0x0;
      uVar35 = (int)pXVar27 + 1;
      bVar23 = uVar35 < (uVar39 & 0xff);
      pXVar27 = (X86RAPass *)(ulong)uVar35;
      if (!bVar23) {
        pXVar27 = unaff_R14;
      }
      bVar31 = bVar23 & bVar16;
    } while ((bool)(bVar23 | bVar16));
    uVar39 = (this->super_X86BaseAlloc)._tiedCount.field_0._packed;
  }
  uVar35 = uVar39 >> 0x10 & 0xff;
  pcVar46 = (char *)unaff_R14;
  if (((uVar30 >> 0x10 & 0xff) != uVar35) && (uVar35 != 0)) {
    pTVar20 = (this->super_X86BaseAlloc)._tiedArray[2];
    uVar28 = 0;
    bVar23 = false;
    do {
      if ((pTVar20[uVar28].flags & 0x400001) == 1) {
        pTVar5 = pTVar20 + uVar28;
        unaff_R14 = (X86RAPass *)pTVar5->vreg;
        bVar31 = *(uint8_t *)((long)&(unaff_R14->super_RAPass)._heap._zone + 5);
        unaff_R12 = (X86RAPass *)(ulong)bVar31;
        uVar38 = (uint32_t)bVar31;
        bVar16 = (pTVar5->field_2).field_0.inPhysId;
        if (bVar31 == bVar16) goto LAB_00130006;
        pXVar27 = (X86RAPass *)(ulong)bVar16;
        dstId = (uint32_t)bVar16;
        pXVar44 = (this->super_X86BaseAlloc)._context;
        if (*(long *)((long)&(pXVar44->_x86State).field_0 + (long)pXVar27 * 8 + 0x80) == 0) {
          uVar30 = ((RegInfo *)((long)&(unaff_R14->super_RAPass).super_CBPass._vptr_CBPass + 4))->
                   _signature & 0xf00;
          uVar35 = (uint)bVar31;
          if (uVar35 == 0xff) {
            if (uVar30 != 0x200) goto LAB_0013011c;
            if (bVar16 == 0xff) goto LAB_00130121;
            if (0x1f < bVar16) goto LAB_00130126;
            uVar24 = *(uint8_t *)((long)&(unaff_R14->super_RAPass)._heap._zone + 4);
            uVar30 = 1 << (bVar16 & 0x1f);
            if (uVar24 == '\x02') {
              X86RAPass::emitLoad(pXVar44,(VirtReg *)unaff_R14,(uint)bVar16,"Alloc");
              unaff_R12 = pXVar27;
            }
            else if (uVar24 == '\x01') goto LAB_00130185;
            *(uint8_t *)((long)&(unaff_R14->super_RAPass)._heap._zone + 6) = '\0';
            *(uint8_t *)((long)&(unaff_R14->super_RAPass)._heap._zone + 4) = '\x01';
            *(byte *)((long)&(unaff_R14->super_RAPass)._heap._zone + 5) = bVar16;
            pZVar3 = &(unaff_R14->super_RAPass)._heap;
            *(uint *)&pZVar3->_zone = *(uint *)&pZVar3->_zone | uVar30;
            *(X86RAPass **)((long)&(pXVar44->_x86State).field_0 + (long)pXVar27 * 8 + 0x80) =
                 unaff_R14;
            puVar6 = &(pXVar44->_x86State)._occupied.field_0.field_0._mm;
            bVar16 = (byte)uVar30;
            *puVar6 = *puVar6 ^ bVar16;
            bVar31 = bVar16;
            if (*(uint8_t *)((long)&(unaff_R14->super_RAPass)._heap._zone + 6) == '\0') {
              bVar31 = 0;
            }
            puVar6 = &(pXVar44->_x86State)._modified.field_0.field_0._mm;
            *puVar6 = *puVar6 ^ bVar31;
            unaff_R14 = (X86RAPass *)(ulong)uVar30;
            X86RAPass::_checkState(pXVar44);
            puVar6 = &(((this->super_X86BaseAlloc)._context)->_clobberedRegs).field_0.field_0._mm;
            *puVar6 = *puVar6 | bVar16;
            pbVar2 = (byte *)((long)&pTVar5->flags + 2);
            *pbVar2 = *pbVar2 | 0x40;
            if ((this->super_X86BaseAlloc)._tiedDone.field_0.field_0._mm == 0xff) goto LAB_0013012b;
          }
          else {
            if (uVar30 != 0x200) goto LAB_0013006f;
            if (*(uint8_t *)((long)&(unaff_R14->super_RAPass)._heap._zone + 4) != '\x01')
            goto LAB_00130074;
            X86RAPass::emitMove(pXVar44,(VirtReg *)unaff_R14,(uint)bVar16,uVar35,"Move");
            if ((((RegInfo *)((long)&(unaff_R14->super_RAPass).super_CBPass._vptr_CBPass + 4))->
                 _signature & 0xf00) != 0x200) goto LAB_00130079;
            if (0x1f < bVar16) goto LAB_0013007e;
            if (0x1f < bVar31) goto LAB_00130083;
            bVar31 = (byte)(1 << (bVar16 & 0x1f));
            bVar17 = bVar31 ^ (byte)(1 << (uVar35 & 0x1f));
            *(byte *)((long)&(unaff_R14->super_RAPass)._heap._zone + 5) = bVar16;
            *(undefined8 *)((long)&(pXVar44->_x86State).field_0 + (ulong)uVar35 * 8 + 0x80) = 0;
            *(X86RAPass **)((long)&(pXVar44->_x86State).field_0 + (long)pXVar27 * 8 + 0x80) =
                 unaff_R14;
            puVar6 = &(pXVar44->_x86State)._occupied.field_0.field_0._mm;
            *puVar6 = *puVar6 ^ bVar17;
            if (*(uint8_t *)((long)&(unaff_R14->super_RAPass)._heap._zone + 6) == '\0') {
              bVar17 = 0;
            }
            puVar6 = &(pXVar44->_x86State)._modified.field_0.field_0._mm;
            *puVar6 = *puVar6 ^ bVar17;
            X86RAPass::_checkState(pXVar44);
            X86RAPass::_checkState(pXVar44);
            puVar6 = &(((this->super_X86BaseAlloc)._context)->_clobberedRegs).field_0.field_0._mm;
            *puVar6 = *puVar6 | bVar31;
            pbVar2 = (byte *)((long)&pTVar5->flags + 2);
            *pbVar2 = *pbVar2 | 0x40;
            if ((this->super_X86BaseAlloc)._tiedDone.field_0.field_0._mm == 0xff) goto LAB_00130088;
          }
          uVar30 = (this->super_X86BaseAlloc)._tiedDone.field_0._packed + 0x10000;
          (this->super_X86BaseAlloc)._tiedDone.field_0._packed = uVar30;
          bVar23 = true;
        }
      }
      uVar35 = (int)uVar28 + 1;
      bVar48 = uVar35 < (uVar39 >> 0x10 & 0xff);
      uVar28 = (ulong)uVar35;
      if (!bVar48) {
        uVar28 = 0;
      }
      bVar49 = bVar48 || bVar23;
      bVar23 = (bool)(bVar23 & bVar48);
    } while (bVar49);
    uVar39 = (this->super_X86BaseAlloc)._tiedCount.field_0._packed;
    pcVar46 = (char *)unaff_R14;
  }
  uVar35 = uVar39 >> 8 & 0xff;
  if (((uVar30 >> 8 & 0xff) != uVar35) && (uVar35 != 0)) {
    pTVar20 = (this->super_X86BaseAlloc)._tiedArray[1];
    uVar28 = 0;
    bVar31 = 0;
    do {
      if ((pTVar20[uVar28].flags & 0x400001) == 1) {
        pTVar5 = pTVar20 + uVar28;
        pXVar44 = (X86RAPass *)pTVar5->vreg;
        bVar16 = *(byte *)((long)&(pXVar44->super_RAPass)._heap._zone + 5);
        unaff_R12 = (X86RAPass *)(ulong)bVar16;
        bVar17 = (pTVar5->field_2).field_0.inPhysId;
        if (bVar16 == bVar17) goto LAB_0013000b;
        pXVar27 = (X86RAPass *)(ulong)bVar17;
        unaff_R14 = (this->super_X86BaseAlloc)._context;
        pcVar46 = (char *)unaff_R14;
        if (*(long *)((long)&(unaff_R14->_x86State).field_0 + (long)pXVar27 * 8 + 0xc0) == 0) {
          uVar30 = *(uint *)((long)&(pXVar44->super_RAPass).super_CBPass._vptr_CBPass + 4) & 0xf00;
          uVar35 = (uint)bVar16;
          if (uVar35 == 0xff) {
            if (uVar30 != 0x100) goto LAB_00130130;
            if (bVar17 == 0xff) goto LAB_00130135;
            if (0x1f < bVar17) goto LAB_0013013a;
            cVar45 = *(char *)((long)&(pXVar44->super_RAPass)._heap._zone + 4);
            uVar30 = 1 << (bVar17 & 0x1f);
            if (cVar45 == '\x02') {
              X86RAPass::emitLoad(unaff_R14,(VirtReg *)pXVar44,(uint)bVar17,"Alloc");
              unaff_R12 = pXVar27;
            }
            else if (cVar45 == '\x01') {
              X86RAPass::emitMove(unaff_R14,(VirtReg *)pXVar44,(uint)bVar17,0xff,"Alloc");
              unaff_R14[2]._x86State.field_0._list[0x19] = (VirtReg *)0x0;
              goto LAB_001301e9;
            }
            *(undefined1 *)((long)&(pXVar44->super_RAPass)._heap._zone + 6) = 0;
            *(undefined1 *)((long)&(pXVar44->super_RAPass)._heap._zone + 4) = 1;
            *(byte *)((long)&(pXVar44->super_RAPass)._heap._zone + 5) = bVar17;
            pZVar3 = &(pXVar44->super_RAPass)._heap;
            *(uint *)&pZVar3->_zone = *(uint *)&pZVar3->_zone | uVar30;
            *(X86RAPass **)((long)&(unaff_R14->_x86State).field_0 + (long)pXVar27 * 8 + 0xc0) =
                 pXVar44;
            puVar7 = &(unaff_R14->_x86State)._occupied.field_0.field_0._vec;
            *puVar7 = *puVar7 ^ uVar30;
            uVar35 = uVar30;
            if (*(char *)((long)&(pXVar44->super_RAPass)._heap._zone + 6) == '\0') {
              uVar35 = 0;
            }
            puVar7 = &(unaff_R14->_x86State)._modified.field_0.field_0._vec;
            *puVar7 = *puVar7 ^ uVar35;
            pcVar46 = (char *)(ulong)uVar30;
            X86RAPass::_checkState(unaff_R14);
            puVar7 = &(((this->super_X86BaseAlloc)._context)->_clobberedRegs).field_0.field_0._vec;
            *puVar7 = *puVar7 | uVar30;
            pbVar2 = (byte *)((long)&pTVar5->flags + 2);
            *pbVar2 = *pbVar2 | 0x40;
            if ((this->super_X86BaseAlloc)._tiedDone.field_0.field_0._vec == 0xff)
            goto LAB_0013013f;
          }
          else {
            if (uVar30 != 0x100) goto LAB_0013008d;
            if (*(char *)((long)&(pXVar44->super_RAPass)._heap._zone + 4) != '\x01')
            goto LAB_00130092;
            X86RAPass::emitMove(unaff_R14,(VirtReg *)pXVar44,(uint)bVar17,uVar35,"Move");
            if (((ulong)(pXVar44->super_RAPass).super_CBPass._vptr_CBPass & 0xf0000000000) !=
                0x10000000000) goto LAB_00130097;
            if (0x1f < bVar17) goto LAB_0013009c;
            if (0x1f < bVar16) goto LAB_001300a1;
            uVar30 = 1 << (bVar17 & 0x1f);
            uVar35 = uVar30 ^ 1 << (uVar35 & 0x1f);
            *(byte *)((long)&(pXVar44->super_RAPass)._heap._zone + 5) = bVar17;
            *(undefined8 *)((long)&(unaff_R14->_x86State).field_0 + (long)unaff_R12 * 8 + 0xc0) = 0;
            *(X86RAPass **)((long)&(unaff_R14->_x86State).field_0 + (long)pXVar27 * 8 + 0xc0) =
                 pXVar44;
            puVar7 = &(unaff_R14->_x86State)._occupied.field_0.field_0._vec;
            *puVar7 = *puVar7 ^ uVar35;
            if (*(char *)((long)&(pXVar44->super_RAPass)._heap._zone + 6) == '\0') {
              uVar35 = 0;
            }
            puVar7 = &(unaff_R14->_x86State)._modified.field_0.field_0._vec;
            *puVar7 = *puVar7 ^ uVar35;
            X86RAPass::_checkState(unaff_R14);
            X86RAPass::_checkState(unaff_R14);
            puVar7 = &(((this->super_X86BaseAlloc)._context)->_clobberedRegs).field_0.field_0._vec;
            *puVar7 = *puVar7 | uVar30;
            pbVar2 = (byte *)((long)&pTVar5->flags + 2);
            *pbVar2 = *pbVar2 | 0x40;
            if ((this->super_X86BaseAlloc)._tiedDone.field_0.field_0._vec == 0xff)
            goto LAB_001300a6;
          }
          pXVar1 = &(this->super_X86BaseAlloc)._tiedDone;
          (pXVar1->field_0)._packed = (pXVar1->field_0)._packed + 0x100;
          bVar31 = 1;
        }
      }
      uVar30 = (int)uVar28 + 1;
      bVar23 = uVar30 < (uVar39 >> 8 & 0xff);
      uVar28 = (ulong)uVar30;
      if (!bVar23) {
        uVar28 = 0;
      }
      bVar48 = (bool)(bVar23 | bVar31);
      bVar31 = bVar31 & bVar23;
    } while (bVar48);
  }
  pXVar27 = (this->super_X86BaseAlloc)._context;
  pXVar21 = (this->super_X86BaseAlloc)._raData;
  uVar39 = (uint)(pXVar27->_x86State)._modified.field_0.field_0._gp &
           *(uint *)&(pXVar27->_x86State)._occupied.field_0 &
           *(uint *)&(pXVar21->clobberedRegs).field_0;
  if (uVar39 != 0) {
    pXVar41 = &pXVar27->_x86State;
    pcVar46 = "Save";
    do {
      if ((uVar39 & 1) != 0) {
        pVVar9 = (pXVar41->field_0)._list[0];
        if (pVVar9 == (VirtReg *)0x0) goto LAB_0012ff3e;
        if (pVVar9->_modified == '\0') goto LAB_0012ff43;
        if ((pVVar9->_tied == (TiedReg *)0x0) || ((pVVar9->_tied->flags & 0x1002) == 0)) {
          if (((pVVar9->_regInfo)._signature & 0xf00) != 0) goto LAB_0012ff9d;
          if (pVVar9->_state != '\x01') goto LAB_0012ffa2;
          bVar31 = pVVar9->_physId;
          if (bVar31 == 0xff) goto LAB_0012ffa7;
          if (0x1f < bVar31) goto LAB_0012ffac;
          pXVar27 = (this->super_X86BaseAlloc)._context;
          X86RAPass::emitSave(pXVar27,pVVar9,(uint)bVar31,"Save");
          pVVar9->_modified = '\0';
          pXVar4 = &(pXVar27->_x86State)._modified;
          (pXVar4->field_0).field_0._gp =
               (pXVar4->field_0).field_0._gp &
               ((ushort)(-2 << (bVar31 & 0x1f)) | (ushort)(0xfffffffe >> 0x20 - (bVar31 & 0x1f)));
          X86RAPass::_checkState(pXVar27);
        }
      }
      pXVar41 = (X86RAState *)((long)&pXVar41->field_0 + 8);
      bVar23 = 1 < uVar39;
      uVar39 = uVar39 >> 1;
    } while (bVar23);
    pXVar27 = (this->super_X86BaseAlloc)._context;
    pXVar21 = (this->super_X86BaseAlloc)._raData;
  }
  uVar39 = (uint)((pXVar27->_x86State)._modified.field_0.field_0._mm &
                 (pXVar21->clobberedRegs).field_0.field_0._mm &
                 (pXVar27->_x86State)._occupied.field_0.field_0._mm);
  if (uVar39 != 0) {
    ppVVar42 = (pXVar27->_x86State).field_0._list + 0x10;
    pcVar46 = "Save";
    do {
      if ((uVar39 & 1) != 0) {
        pVVar9 = *ppVVar42;
        if (pVVar9 == (VirtReg *)0x0) goto LAB_0012ff48;
        if (pVVar9->_modified == '\0') goto LAB_0012ff4d;
        if ((pVVar9->_tied == (TiedReg *)0x0) || ((pVVar9->_tied->flags & 0x1002) == 0)) {
          if (((pVVar9->_regInfo)._signature & 0xf00) != 0x200) goto LAB_0012ffb1;
          if (pVVar9->_state != '\x01') goto LAB_0012ffb6;
          bVar31 = pVVar9->_physId;
          if (bVar31 == 0xff) goto LAB_0012ffbb;
          if (0x1f < bVar31) goto LAB_0012ffc0;
          pXVar27 = (this->super_X86BaseAlloc)._context;
          X86RAPass::emitSave(pXVar27,pVVar9,(uint)bVar31,"Save");
          pVVar9->_modified = '\0';
          puVar6 = &(pXVar27->_x86State)._modified.field_0.field_0._mm;
          *puVar6 = *puVar6 & ~(byte)(1 << (bVar31 & 0x1f));
          X86RAPass::_checkState(pXVar27);
        }
      }
      ppVVar42 = ppVVar42 + 1;
      bVar23 = 1 < uVar39;
      uVar39 = uVar39 >> 1;
    } while (bVar23);
    pXVar27 = (this->super_X86BaseAlloc)._context;
    pXVar21 = (this->super_X86BaseAlloc)._raData;
  }
  uVar39 = (pXVar27->_x86State)._occupied.field_0.field_0._vec &
           (pXVar21->clobberedRegs).field_0.field_0._vec &
           (pXVar27->_x86State)._modified.field_0.field_0._vec;
  if (uVar39 != 0) {
    ppVVar42 = (pXVar27->_x86State).field_0._list + 0x18;
    pcVar46 = "Save";
    do {
      if ((uVar39 & 1) != 0) {
        pVVar9 = *ppVVar42;
        if (pVVar9 == (VirtReg *)0x0) goto LAB_0012ff57;
        if (pVVar9->_modified == '\0') goto LAB_0012ff5c;
        if ((pVVar9->_tied == (TiedReg *)0x0) || ((pVVar9->_tied->flags & 0x1002) == 0)) {
          if (((pVVar9->_regInfo)._signature & 0xf00) != 0x100) goto LAB_0012ffc5;
          if (pVVar9->_state != '\x01') goto LAB_0012ffca;
          bVar31 = pVVar9->_physId;
          if (bVar31 == 0xff) goto LAB_0012ffcf;
          if (0x1f < bVar31) goto LAB_0012ffd4;
          pXVar27 = (this->super_X86BaseAlloc)._context;
          X86RAPass::emitSave(pXVar27,pVVar9,(uint)bVar31,"Save");
          pVVar9->_modified = '\0';
          puVar7 = &(pXVar27->_x86State)._modified.field_0.field_0._vec;
          *puVar7 = *puVar7 & (-2 << (bVar31 & 0x1f) | 0xfffffffeU >> 0x20 - (bVar31 & 0x1f));
          X86RAPass::_checkState(pXVar27);
        }
      }
      ppVVar42 = ppVVar42 + 1;
      bVar23 = 1 < uVar39;
      uVar39 = uVar39 >> 1;
    } while (bVar23);
  }
  pCVar11 = (this->super_X86BaseAlloc)._node;
  bVar31 = *(byte *)&pCVar11[3]._inlineComment;
  if ((ulong)bVar31 != 0) {
    pcVar46 = *(char **)&pCVar11[8]._type;
    uVar28 = 0;
    do {
      if (((((Imm *)pcVar46)->super_Operand).super_Operand_.field_0._any.signature & 7) == 3) {
        if (0x1f < uVar28) goto LAB_0012ff52;
        uVar39 = *(uint *)(&pCVar11[4]._type + uVar28 * 4);
        if ((uVar39 >> 0x10 & 1) == 0) {
          pXVar27 = (this->super_X86BaseAlloc)._context;
          uVar30 = (pXVar27->_zsp).super_X86Reg.super_Reg.super_Operand.super_Operand_.field_0._any.
                   signature;
          local_50._any.reserved8_4 = (uVar39 & 0xffff) - (uVar30 >> 0x18);
          local_50._packed[0] = (UInt64)((ulong)(uVar30 & 0xf8) | 2);
          local_50._any.reserved12_4 =
               (pXVar27->_zsp).super_X86Reg.super_Reg.super_Operand.super_Operand_.field_0._any.id;
          X86RAPass::emitImmToStack(pXVar27,uVar39 >> 0x18,(X86Mem *)&local_50._any,(Imm *)pcVar46);
        }
        else {
          X86RAPass::emitImmToReg
                    ((this->super_X86BaseAlloc)._context,uVar39 >> 0x18,uVar39 & 0xff,(Imm *)pcVar46
                    );
        }
      }
      uVar28 = uVar28 + 1;
      pcVar46 = (char *)((long)pcVar46 + 0x10);
    } while (bVar31 != uVar28);
  }
  uVar39 = (this->super_X86BaseAlloc)._tiedCount.field_0._packed;
  uVar28 = (ulong)uVar39;
  if ((uVar39 & 0xff) != 0) {
    pTVar20 = (this->super_X86BaseAlloc)._tiedArray[0];
    uVar29 = 0;
    do {
      if ((pTVar20[uVar29].flags & 1) != 0) {
        pTVar5 = pTVar20 + uVar29;
        uVar39 = pTVar5->inRegs;
        if (uVar39 != 0) {
          pVVar9 = pTVar5->vreg;
          bVar31 = pVVar9->_physId;
          if (bVar31 == 0xff) goto LAB_0012ffd9;
          if (0x1f < bVar31) goto LAB_0012ffde;
          uVar39 = uVar39 & (-2 << (bVar31 & 0x1f) | 0xfffffffeU >> 0x20 - (bVar31 & 0x1f));
          uVar43 = (ulong)uVar39;
          if (uVar39 != 0) {
            uVar38 = 0;
            do {
              if ((uVar43 & 1) != 0) {
                X86RAPass::emitMove((this->super_X86BaseAlloc)._context,pVVar9,uVar38,(uint)bVar31,
                                    "Duplicate");
                if (0x1f < uVar38) {
                  run();
                  goto LAB_0012fea8;
                }
                pXVar4 = &((this->super_X86BaseAlloc)._context)->_clobberedRegs;
                (pXVar4->field_0).field_0._gp =
                     (pXVar4->field_0).field_0._gp | (ushort)(1 << ((byte)uVar38 & 0x1f));
              }
              uVar38 = uVar38 + 1;
              uVar39 = (uint)uVar43;
              uVar43 = uVar43 >> 1;
            } while (1 < uVar39);
          }
        }
      }
      uVar29 = uVar29 + 1;
    } while (uVar29 != (uVar28 & 0xff));
    uVar28 = (ulong)(this->super_X86BaseAlloc)._tiedCount.field_0._packed;
    pcVar46 = (char *)this;
  }
  uVar39 = (uint)uVar28;
  if ((uVar28 & 0xff0000) != 0) {
    pTVar20 = (this->super_X86BaseAlloc)._tiedArray[2];
    uVar29 = 0;
    do {
      if ((pTVar20[uVar29].flags & 1) != 0) {
        pTVar5 = pTVar20 + uVar29;
        uVar39 = pTVar5->inRegs;
        if (uVar39 != 0) {
          pVVar9 = pTVar5->vreg;
          bVar31 = pVVar9->_physId;
          if (bVar31 == 0xff) goto LAB_0012ffe3;
          if (0x1f < bVar31) goto LAB_0012ffe8;
          uVar39 = uVar39 & (-2 << (bVar31 & 0x1f) | 0xfffffffeU >> 0x20 - (bVar31 & 0x1f));
          if (uVar39 != 0) {
            uVar38 = 0;
            do {
              if ((uVar39 & 1) != 0) {
                X86RAPass::emitMove((this->super_X86BaseAlloc)._context,pVVar9,uVar38,(uint)bVar31,
                                    "Duplicate");
                if (0x1f < uVar38) goto LAB_0012fea8;
                puVar6 = &(((this->super_X86BaseAlloc)._context)->_clobberedRegs).field_0.field_0.
                          _mm;
                *puVar6 = *puVar6 | (byte)(1 << ((byte)uVar38 & 0x1f));
              }
              uVar38 = uVar38 + 1;
              bVar23 = 1 < uVar39;
              uVar39 = uVar39 >> 1;
            } while (bVar23);
          }
        }
      }
      uVar29 = uVar29 + 1;
    } while (uVar29 != ((uint)(uVar28 >> 0x10) & 0xff));
    uVar39 = (this->super_X86BaseAlloc)._tiedCount.field_0._packed;
    pcVar46 = (char *)this;
  }
  uVar39 = uVar39 >> 8 & 0xff;
  if (uVar39 != 0) {
    pTVar20 = (this->super_X86BaseAlloc)._tiedArray[1];
    uVar28 = 0;
    do {
      if ((pTVar20[uVar28].flags & 1) != 0) {
        pTVar5 = pTVar20 + uVar28;
        uVar30 = pTVar5->inRegs;
        if (uVar30 != 0) {
          pVVar9 = pTVar5->vreg;
          bVar31 = pVVar9->_physId;
          if (bVar31 == 0xff) goto LAB_0012ffed;
          if (0x1f < bVar31) goto LAB_0012fff2;
          uVar30 = uVar30 & (-2 << (bVar31 & 0x1f) | 0xfffffffeU >> 0x20 - (bVar31 & 0x1f));
          if (uVar30 != 0) {
            uVar38 = 0;
            do {
              if ((uVar30 & 1) != 0) {
                X86RAPass::emitMove((this->super_X86BaseAlloc)._context,pVVar9,uVar38,(uint)bVar31,
                                    "Duplicate");
                if (0x1f < uVar38) goto LAB_0012fead;
                puVar7 = &(((this->super_X86BaseAlloc)._context)->_clobberedRegs).field_0.field_0.
                          _vec;
                *puVar7 = *puVar7 | 1 << ((byte)uVar38 & 0x1f);
              }
              uVar38 = uVar38 + 1;
              bVar23 = 1 < uVar30;
              uVar30 = uVar30 >> 1;
            } while (bVar23);
          }
        }
      }
      uVar28 = uVar28 + 1;
      pcVar46 = (char *)this;
    } while (uVar28 != uVar39);
  }
  pCVar14 = local_40;
  X86RAPass_translateOperands
            ((this->super_X86BaseAlloc)._context,
             &((local_40->super_CBInst)._opArray)->super_Operand_,
             (uint)(local_40->super_CBInst).super_CBNode._opCount);
  this_00 = (CodeEmitter *)(this->super_X86BaseAlloc)._cc;
  this_00[3]._vptr_CodeEmitter = (_func_int **)pCVar14;
  if ((((pCVar14->_funcDetail)._callConv._flags & 1) != 0) &&
     (uVar38 = (pCVar14->_funcDetail)._argStackSize, uVar38 != 0)) {
    CodeEmitter::emit(this_00,0x2c4,(Operand_ *)&((this->super_X86BaseAlloc)._context)->_zsp,uVar38)
    ;
  }
  pXVar27 = (this->super_X86BaseAlloc)._context;
  pXVar21 = (this->super_X86BaseAlloc)._raData;
  uVar39 = (uint)((pXVar27->_x86State)._occupied.field_0.field_0._gp &
                 (pXVar21->clobberedRegs).field_0.field_0._gp);
  if (uVar39 != 0) {
    pXVar41 = &pXVar27->_x86State;
    do {
      if ((uVar39 & 1) != 0) {
        pVVar9 = (pXVar41->field_0)._list[0];
        if (pVVar9 == (VirtReg *)0x0) goto LAB_0012ff61;
        if ((pVVar9->_modified == '\0') ||
           ((pVVar9->_tied != (TiedReg *)0x0 && ((pVVar9->_tied->flags & 0x122a) != 0)))) {
          uVar24 = '\x02';
        }
        else {
          uVar24 = '\0';
        }
        if (((pVVar9->_regInfo)._signature & 0xf00) != 0) goto LAB_0012ff66;
        pcVar46 = (char *)(this->super_X86BaseAlloc)._context;
        bVar31 = pVVar9->_physId;
        if (bVar31 == 0xff) {
          pVVar9->_state = uVar24;
        }
        else {
          if (0x1f < bVar31) goto LAB_0012fff7;
          pVVar9->_state = uVar24;
          pVVar9->_physId = 0xff;
          pVVar9->_modified = '\0';
          uVar18 = (ushort)(-2 << (bVar31 & 0x1f)) | (ushort)(0xfffffffe >> 0x20 - (bVar31 & 0x1f));
          (((X86RAPass *)pcVar46)->_x86State).field_0._list[(uint)bVar31] = (VirtReg *)0x0;
          pXVar4 = &(((X86RAPass *)pcVar46)->_x86State)._occupied;
          (pXVar4->field_0).field_0._gp = (pXVar4->field_0).field_0._gp & uVar18;
          pXVar4 = &(((X86RAPass *)pcVar46)->_x86State)._modified;
          (pXVar4->field_0).field_0._gp = (pXVar4->field_0).field_0._gp & uVar18;
          X86RAPass::_checkState((X86RAPass *)pcVar46);
        }
        X86RAPass::_checkState((X86RAPass *)pcVar46);
      }
      pXVar41 = (X86RAState *)((long)&pXVar41->field_0 + 8);
      bVar23 = 1 < uVar39;
      uVar39 = uVar39 >> 1;
    } while (bVar23);
    pXVar27 = (this->super_X86BaseAlloc)._context;
    pXVar21 = (this->super_X86BaseAlloc)._raData;
  }
  uVar39 = (uint)((pXVar27->_x86State)._occupied.field_0.field_0._mm &
                 (pXVar21->clobberedRegs).field_0.field_0._mm);
  if (uVar39 != 0) {
    ppVVar42 = (pXVar27->_x86State).field_0._list + 0x10;
    do {
      if ((uVar39 & 1) != 0) {
        pVVar9 = *ppVVar42;
        if (pVVar9 == (VirtReg *)0x0) goto LAB_0012ff6b;
        if ((pVVar9->_modified == '\0') ||
           ((pVVar9->_tied != (TiedReg *)0x0 && ((pVVar9->_tied->flags & 0x122a) != 0)))) {
          uVar24 = '\x02';
        }
        else {
          uVar24 = '\0';
        }
        if (((pVVar9->_regInfo)._signature & 0xf00) != 0x200) goto LAB_0012ff70;
        pcVar46 = (char *)(this->super_X86BaseAlloc)._context;
        bVar31 = pVVar9->_physId;
        if (bVar31 == 0xff) {
          pVVar9->_state = uVar24;
        }
        else {
          if (0x1f < bVar31) goto LAB_0012fffc;
          pVVar9->_state = uVar24;
          pVVar9->_physId = 0xff;
          pVVar9->_modified = '\0';
          *(undefined8 *)
           ((long)&(((X86RAPass *)pcVar46)->_x86State).field_0 + (ulong)(uint)bVar31 * 8 + 0x80) = 0
          ;
          bVar31 = ~(byte)(1 << (bVar31 & 0x1f));
          puVar6 = &(((X86RAPass *)pcVar46)->_x86State)._occupied.field_0.field_0._mm;
          *puVar6 = *puVar6 & bVar31;
          puVar6 = &(((X86RAPass *)pcVar46)->_x86State)._modified.field_0.field_0._mm;
          *puVar6 = *puVar6 & bVar31;
          X86RAPass::_checkState((X86RAPass *)pcVar46);
        }
        X86RAPass::_checkState((X86RAPass *)pcVar46);
      }
      ppVVar42 = ppVVar42 + 1;
      bVar23 = 1 < uVar39;
      uVar39 = uVar39 >> 1;
    } while (bVar23);
    pXVar27 = (this->super_X86BaseAlloc)._context;
    pXVar21 = (this->super_X86BaseAlloc)._raData;
  }
  uVar39 = (pXVar27->_x86State)._occupied.field_0.field_0._vec &
           (pXVar21->clobberedRegs).field_0.field_0._vec;
  if (uVar39 != 0) {
    ppVVar42 = (pXVar27->_x86State).field_0._list + 0x18;
    do {
      if ((uVar39 & 1) != 0) {
        pVVar9 = *ppVVar42;
        if (pVVar9 == (VirtReg *)0x0) goto LAB_0012ff75;
        if ((pVVar9->_modified == '\0') ||
           ((pVVar9->_tied != (TiedReg *)0x0 && ((pVVar9->_tied->flags & 0x122a) != 0)))) {
          uVar24 = '\x02';
        }
        else {
          uVar24 = '\0';
        }
        if (((pVVar9->_regInfo)._signature & 0xf00) != 0x100) goto LAB_0012ff7a;
        pcVar46 = (char *)(this->super_X86BaseAlloc)._context;
        bVar31 = pVVar9->_physId;
        if (bVar31 == 0xff) {
          pVVar9->_state = uVar24;
        }
        else {
          if (0x1f < bVar31) goto LAB_00130001;
          pVVar9->_state = uVar24;
          pVVar9->_physId = 0xff;
          pVVar9->_modified = '\0';
          uVar30 = -2 << (bVar31 & 0x1f) | 0xfffffffeU >> 0x20 - (bVar31 & 0x1f);
          *(undefined8 *)
           ((long)&(((X86RAPass *)pcVar46)->_x86State).field_0 + (ulong)(uint)bVar31 * 8 + 0xc0) = 0
          ;
          puVar7 = &(((X86RAPass *)pcVar46)->_x86State)._occupied.field_0.field_0._vec;
          *puVar7 = *puVar7 & uVar30;
          puVar7 = &(((X86RAPass *)pcVar46)->_x86State)._modified.field_0.field_0._vec;
          *puVar7 = *puVar7 & uVar30;
          X86RAPass::_checkState((X86RAPass *)pcVar46);
        }
        X86RAPass::_checkState((X86RAPass *)pcVar46);
      }
      ppVVar42 = ppVVar42 + 1;
      bVar23 = 1 < uVar39;
      uVar39 = uVar39 >> 1;
    } while (bVar23);
  }
  pCVar11 = (this->super_X86BaseAlloc)._node;
  lVar25 = 0;
  unaff_R14 = (X86RAPass *)CONCAT71((int7)((ulong)pcVar46 >> 8),1);
  do {
    uVar39 = *(uint *)((long)&pCVar11[4]._next + lVar25 * 4);
    if ((((uVar39 >> 0x10 & 1) == 0) ||
        (ppcVar22 = &pCVar11[7]._inlineComment + lVar25 * 2, ((ulong)*ppcVar22 & 7) != 1)) ||
       (uVar30 = *(uint *)((long)ppcVar22 + 4), uVar30 < 0x100)) goto LAB_0012fc2e;
    if (uVar30 == 0xffffffff) goto LAB_00130033;
    pXVar12 = (this->super_X86BaseAlloc)._cc;
    if ((pXVar12->super_CodeCompiler)._vRegArray.super_ZoneVectorBase._length <=
        (ulong)(uVar30 - 0x100)) goto LAB_00130038;
    pVVar9 = *(VirtReg **)
              ((long)(pXVar12->super_CodeCompiler)._vRegArray.super_ZoneVectorBase._data +
              (ulong)(uVar30 - 0x100) * 8);
    uVar35 = uVar39 & 0xff;
    unaff_R12 = (X86RAPass *)(ulong)uVar35;
    uVar30 = (pVVar9->_regInfo)._signature >> 8 & 0xf;
    bVar31 = (byte)uVar39;
    if (uVar30 == 2) {
      pXVar44 = (this->super_X86BaseAlloc)._context;
      bVar16 = pVVar9->_physId;
      if (bVar16 == 0xff) {
        pVVar9->_state = '\0';
      }
      else {
        if (0x1f < bVar16) goto LAB_00130158;
        pVVar9->_state = '\0';
        pVVar9->_physId = 0xff;
        pVVar9->_modified = '\0';
        *(undefined8 *)((long)&(pXVar44->_x86State).field_0 + (ulong)(uint)bVar16 * 8 + 0x80) = 0;
        bVar16 = ~(byte)(1 << (bVar16 & 0x1f));
        puVar6 = &(pXVar44->_x86State)._occupied.field_0.field_0._mm;
        *puVar6 = *puVar6 & bVar16;
        puVar6 = &(pXVar44->_x86State)._modified.field_0.field_0._mm;
        *puVar6 = *puVar6 & bVar16;
        X86RAPass::_checkState(pXVar44);
      }
      X86RAPass::_checkState(pXVar44);
      if (((pVVar9->_regInfo)._signature & 0xf00) != 0x200) goto LAB_001300d8;
      if (uVar35 == 0xff) goto LAB_001300dd;
      if (0x1f < uVar35) {
        run();
LAB_001300ff:
        DebugUtils::assertionFailed
                  ("/workspace/llm4binary/github/license_all_cmakelists_25/hypeartist[P]asmjit-1/src/asmjit/x86/../x86/x86regalloc_p.h"
                   ,0x164,"C != X86Reg::kKindGp || physId != X86Gp::kIdSp");
      }
      uVar39 = 1 << (bVar31 & 0x1f);
      pXVar27 = (this->super_X86BaseAlloc)._context;
      pVVar9->_state = '\x01';
      pVVar9->_modified = '\x01';
      pVVar9->_physId = bVar31;
      pVVar9->_homeMask = pVVar9->_homeMask | uVar39;
      *(VirtReg **)((long)&(pXVar27->_x86State).field_0 + (long)unaff_R12 * 8 + 0x80) = pVVar9;
      puVar6 = &(pXVar27->_x86State)._occupied.field_0.field_0._mm;
      bVar31 = (byte)uVar39;
      *puVar6 = *puVar6 | bVar31;
      puVar6 = &(pXVar27->_x86State)._modified.field_0.field_0._mm;
      *puVar6 = *puVar6 | bVar31;
LAB_0012fc24:
      X86RAPass::_checkState(pXVar27);
    }
    else if (uVar30 == 1) {
      uVar39 = uVar39 >> 8 & 0xff;
      if (0x1f < uVar39) goto LAB_001300ce;
      if ((*(uint *)(x86OpData + (ulong)uVar39 * 4) & 0xf00) == 0x100) {
        pXVar44 = (this->super_X86BaseAlloc)._context;
        bVar16 = pVVar9->_physId;
        if (bVar16 == 0xff) {
          pVVar9->_state = '\0';
        }
        else {
          if (0x1f < bVar16) goto LAB_0013017b;
          pVVar9->_state = '\0';
          pVVar9->_physId = 0xff;
          pVVar9->_modified = '\0';
          uVar39 = -2 << (bVar16 & 0x1f) | 0xfffffffeU >> 0x20 - (bVar16 & 0x1f);
          *(undefined8 *)((long)&(pXVar44->_x86State).field_0 + (ulong)(uint)bVar16 * 8 + 0xc0) = 0;
          puVar7 = &(pXVar44->_x86State)._occupied.field_0.field_0._vec;
          *puVar7 = *puVar7 & uVar39;
          puVar7 = &(pXVar44->_x86State)._modified.field_0.field_0._vec;
          *puVar7 = *puVar7 & uVar39;
          X86RAPass::_checkState(pXVar44);
        }
        X86RAPass::_checkState(pXVar44);
        if (((pVVar9->_regInfo)._signature & 0xf00) == 0x100) {
          if (uVar35 != 0xff) {
            if (uVar35 < 0x20) {
              uVar39 = 1 << (bVar31 & 0x1f);
              pXVar27 = (this->super_X86BaseAlloc)._context;
              pVVar9->_state = '\x01';
              pVVar9->_modified = '\x01';
              pVVar9->_physId = bVar31;
              pVVar9->_homeMask = pVVar9->_homeMask | uVar39;
              *(VirtReg **)((long)&(pXVar27->_x86State).field_0 + (long)unaff_R12 * 8 + 0xc0) =
                   pVVar9;
              puVar7 = &(pXVar27->_x86State)._occupied.field_0.field_0._vec;
              *puVar7 = *puVar7 | uVar39;
              puVar7 = &(pXVar27->_x86State)._modified.field_0.field_0._vec;
              *puVar7 = *puVar7 | uVar39;
              goto LAB_0012fc24;
            }
            goto LAB_00130176;
          }
          goto LAB_00130171;
        }
        goto LAB_00130167;
      }
      pXVar44 = (X86RAPass *)this;
      if ((long)(char)pVVar9->_typeId < 0) goto LAB_00130162;
      cVar45 = TypeId::_info[(long)(char)pVVar9->_typeId + 0x80];
      pXVar44 = (this->super_X86BaseAlloc)._context;
      unaff_R12 = pXVar44;
      if (pVVar9->_memCell == (RACell *)0x0) {
        RAPass::_newVarCell(&pXVar44->super_RAPass,pVVar9);
        unaff_R12 = (this->super_X86BaseAlloc)._context;
      }
      local_50._any.reserved12_4 = pVVar9->_id;
      local_50._any.reserved8_4 = 0;
      local_50._any.id = 0xffffffff;
      local_50._any.signature =
           (((pXVar44->super_RAPass).super_CBPass._cb)->super_CodeEmitter)._nativeGpReg.
           super_Operand.super_Operand_.field_0._any.signature & 0xf8 | 0x8002 |
           (uint)(cVar45 != '*') * 0x4000000 + 0x4000000;
      if (((pVVar9->_regInfo)._signature & 0xf00) != 0x100) goto LAB_0013016c;
      bVar31 = pVVar9->_physId;
      if (bVar31 == 0xff) {
        pVVar9->_state = '\x02';
      }
      else {
        if (0x1f < bVar31) goto LAB_00130180;
        pVVar9->_state = '\x02';
        pVVar9->_physId = 0xff;
        pVVar9->_modified = '\0';
        uVar39 = -2 << (bVar31 & 0x1f) | 0xfffffffeU >> 0x20 - (bVar31 & 0x1f);
        *(undefined8 *)((long)&(unaff_R12->_x86State).field_0 + (ulong)(uint)bVar31 * 8 + 0xc0) = 0;
        puVar7 = &(unaff_R12->_x86State)._occupied.field_0.field_0._vec;
        *puVar7 = *puVar7 & uVar39;
        puVar7 = &(unaff_R12->_x86State)._modified.field_0.field_0._vec;
        *puVar7 = *puVar7 & uVar39;
        X86RAPass::_checkState(unaff_R12);
      }
      X86RAPass::_checkState(unaff_R12);
      CodeEmitter::emit((CodeEmitter *)(this->super_X86BaseAlloc)._cc,0xe7,
                        (Operand_ *)&local_50._any);
    }
    else if (uVar30 == 0) {
      pXVar44 = (this->super_X86BaseAlloc)._context;
      bVar16 = pVVar9->_physId;
      if (bVar16 == 0xff) {
        pVVar9->_state = '\0';
      }
      else {
        if (0x1f < bVar16) goto LAB_0013015d;
        pVVar9->_state = '\0';
        pVVar9->_physId = 0xff;
        pVVar9->_modified = '\0';
        uVar18 = (ushort)(-2 << (bVar16 & 0x1f)) | (ushort)(0xfffffffe >> 0x20 - (bVar16 & 0x1f));
        (pXVar44->_x86State).field_0._list[(uint)bVar16] = (VirtReg *)0x0;
        pXVar4 = &(pXVar44->_x86State)._occupied;
        (pXVar4->field_0).field_0._gp = (pXVar4->field_0).field_0._gp & uVar18;
        pXVar4 = &(pXVar44->_x86State)._modified;
        (pXVar4->field_0).field_0._gp = (pXVar4->field_0).field_0._gp & uVar18;
        X86RAPass::_checkState(pXVar44);
      }
      X86RAPass::_checkState(pXVar44);
      if (((pVVar9->_regInfo)._signature & 0xf00) != 0) goto LAB_001300d3;
      if (bVar31 == 0xff) goto LAB_001300e2;
      if ((uVar39 & 0xff) == 4) goto LAB_001300ff;
      if (uVar35 < 0x20) {
        uVar39 = 1 << (bVar31 & 0x1f);
        pXVar27 = (this->super_X86BaseAlloc)._context;
        pVVar9->_state = '\x01';
        pVVar9->_modified = '\x01';
        pVVar9->_physId = bVar31;
        pVVar9->_homeMask = pVVar9->_homeMask | uVar39;
        (pXVar27->_x86State).field_0._list[(long)unaff_R12] = pVVar9;
        pXVar4 = &(pXVar27->_x86State)._occupied;
        uVar18 = (ushort)uVar39;
        (pXVar4->field_0).field_0._gp = (pXVar4->field_0).field_0._gp | uVar18;
        pXVar4 = &(pXVar27->_x86State)._modified;
        (pXVar4->field_0).field_0._gp = (pXVar4->field_0).field_0._gp | uVar18;
        goto LAB_0012fc24;
      }
      run();
LAB_0013011c:
      run();
LAB_00130121:
      run();
LAB_00130126:
      run();
LAB_0013012b:
      run();
LAB_00130130:
      run();
LAB_00130135:
      run();
      pcVar46 = (char *)unaff_R14;
LAB_0013013a:
      run();
LAB_0013013f:
      this = (X86CallAlloc *)pXVar44;
      run();
LAB_00130144:
      run();
LAB_00130149:
      run();
      unaff_R14 = (X86RAPass *)pcVar46;
LAB_0013014e:
      run();
      pXVar44 = (X86RAPass *)this;
LAB_00130153:
      run();
LAB_00130158:
      run();
LAB_0013015d:
      run();
LAB_00130162:
      run();
LAB_00130167:
      run();
LAB_0013016c:
      run();
LAB_00130171:
      run();
LAB_00130176:
      run();
LAB_0013017b:
      this = (X86CallAlloc *)pXVar44;
      run();
LAB_00130180:
      uVar38 = (uint32_t)unaff_R12;
      run();
      pXVar44 = (X86RAPass *)this;
      dstId = extraout_EDX;
LAB_00130185:
      X86RAPass::emitMove(pXVar44,(VirtReg *)unaff_R14,dstId,uVar38,"Alloc");
      pXVar44[2]._x86State.field_0._list[0x11] = (VirtReg *)0x0;
LAB_001301e9:
      DebugUtils::assertionFailed
                ("/workspace/llm4binary/github/license_all_cmakelists_25/hypeartist[P]asmjit-1/src/asmjit/x86/../base/../base/../base/../base/utils.h"
                 ,0x13e,"x < 32");
    }
LAB_0012fc2e:
    lVar25 = 1;
    cVar45 = (char)unaff_R14;
    unaff_R14 = (X86RAPass *)0x0;
  } while (cVar45 != '\0');
  uVar39 = (this->super_X86BaseAlloc)._tiedCount.field_0._packed;
  if ((uVar39 & 0xff) != 0) {
    pTVar20 = (this->super_X86BaseAlloc)._tiedArray[0];
    lVar25 = 0;
    do {
      if ((*(byte *)((long)&pTVar20->flags + lVar25 + 1) & 0x10) != 0) {
        lVar13 = *(long *)((long)&pTVar20->vreg + lVar25);
        if ((*(byte *)(lVar13 + 5) & 0xf) != 0) goto LAB_0012ff7f;
        pXVar27 = (this->super_X86BaseAlloc)._context;
        bVar31 = *(byte *)(lVar13 + 0x25);
        if (bVar31 == 0xff) {
          *(undefined1 *)(lVar13 + 0x24) = 0;
        }
        else {
          if (0x1f < bVar31) goto LAB_00130010;
          *(undefined2 *)(lVar13 + 0x24) = 0xff00;
          *(undefined1 *)(lVar13 + 0x26) = 0;
          uVar18 = (ushort)(-2 << (bVar31 & 0x1f)) | (ushort)(0xfffffffe >> 0x20 - (bVar31 & 0x1f));
          (pXVar27->_x86State).field_0._list[(uint)bVar31] = (VirtReg *)0x0;
          pXVar4 = &(pXVar27->_x86State)._occupied;
          (pXVar4->field_0).field_0._gp = (pXVar4->field_0).field_0._gp & uVar18;
          pXVar4 = &(pXVar27->_x86State)._modified;
          (pXVar4->field_0).field_0._gp = (pXVar4->field_0).field_0._gp & uVar18;
          X86RAPass::_checkState(pXVar27);
        }
        X86RAPass::_checkState(pXVar27);
      }
      lVar25 = lVar25 + 0x18;
    } while ((ulong)((uVar39 & 0xff) << 3) * 3 != lVar25);
    uVar39 = (this->super_X86BaseAlloc)._tiedCount.field_0._packed;
  }
  uVar30 = uVar39 >> 0x10 & 0xff;
  if (uVar30 != 0) {
    pTVar20 = (this->super_X86BaseAlloc)._tiedArray[2];
    lVar25 = 0;
    do {
      if ((*(byte *)((long)&pTVar20->flags + lVar25 + 1) & 0x10) != 0) {
        lVar13 = *(long *)((long)&pTVar20->vreg + lVar25);
        if ((*(uint *)(lVar13 + 4) & 0xf00) != 0x200) goto LAB_0012ff84;
        pXVar27 = (this->super_X86BaseAlloc)._context;
        bVar31 = *(byte *)(lVar13 + 0x25);
        if (bVar31 == 0xff) {
          *(undefined1 *)(lVar13 + 0x24) = 0;
        }
        else {
          if (0x1f < bVar31) goto LAB_00130015;
          *(undefined2 *)(lVar13 + 0x24) = 0xff00;
          *(undefined1 *)(lVar13 + 0x26) = 0;
          *(undefined8 *)((long)&(pXVar27->_x86State).field_0 + (ulong)(uint)bVar31 * 8 + 0x80) = 0;
          bVar31 = ~(byte)(1 << (bVar31 & 0x1f));
          puVar6 = &(pXVar27->_x86State)._occupied.field_0.field_0._mm;
          *puVar6 = *puVar6 & bVar31;
          puVar6 = &(pXVar27->_x86State)._modified.field_0.field_0._mm;
          *puVar6 = *puVar6 & bVar31;
          X86RAPass::_checkState(pXVar27);
        }
        X86RAPass::_checkState(pXVar27);
      }
      lVar25 = lVar25 + 0x18;
    } while ((ulong)(uVar30 << 3) * 3 != lVar25);
    uVar39 = (this->super_X86BaseAlloc)._tiedCount.field_0._packed;
  }
  uVar39 = uVar39 >> 8 & 0xff;
  if (uVar39 != 0) {
    pTVar20 = (this->super_X86BaseAlloc)._tiedArray[1];
    lVar25 = 0;
    do {
      if ((*(byte *)((long)&pTVar20->flags + lVar25 + 1) & 0x10) != 0) {
        lVar13 = *(long *)((long)&pTVar20->vreg + lVar25);
        if ((*(uint *)(lVar13 + 4) & 0xf00) != 0x100) goto LAB_0012ff89;
        pXVar27 = (this->super_X86BaseAlloc)._context;
        bVar31 = *(byte *)(lVar13 + 0x25);
        if (bVar31 == 0xff) {
          *(undefined1 *)(lVar13 + 0x24) = 0;
        }
        else {
          if (0x1f < bVar31) goto LAB_0013001f;
          *(undefined2 *)(lVar13 + 0x24) = 0xff00;
          *(undefined1 *)(lVar13 + 0x26) = 0;
          uVar30 = -2 << (bVar31 & 0x1f) | 0xfffffffeU >> 0x20 - (bVar31 & 0x1f);
          *(undefined8 *)((long)&(pXVar27->_x86State).field_0 + (ulong)(uint)bVar31 * 8 + 0xc0) = 0;
          puVar7 = &(pXVar27->_x86State)._occupied.field_0.field_0._vec;
          *puVar7 = *puVar7 & uVar30;
          puVar7 = &(pXVar27->_x86State)._modified.field_0.field_0._vec;
          *puVar7 = *puVar7 & uVar30;
          X86RAPass::_checkState(pXVar27);
        }
        X86RAPass::_checkState(pXVar27);
      }
      lVar25 = lVar25 + 0x18;
    } while ((ulong)(uVar39 << 3) * 3 != lVar25);
  }
  uVar28 = (ulong)(this->super_X86BaseAlloc)._tiedTotal;
  if (uVar28 != 0) {
    lVar25 = 0;
    do {
      *(undefined8 *)
       (*(long *)((long)&(this->super_X86BaseAlloc)._tiedArray[0]->vreg + lVar25) + 0x30) = 0;
      lVar25 = lVar25 + 0x18;
    } while (uVar28 * 0x18 != lVar25);
  }
  return 0;
LAB_0012fea8:
  run();
LAB_0012fead:
  run();
LAB_0012feb2:
  run();
LAB_0012feb7:
  run();
LAB_0012febc:
  run();
LAB_0012fec1:
  run();
LAB_0012fec6:
  run();
LAB_0012fecb:
  run();
LAB_0012fed0:
  run();
LAB_0012fed5:
  run();
LAB_0012feda:
  run();
LAB_0012fedf:
  run();
LAB_0012fee4:
  run();
LAB_0012fee9:
  run();
LAB_0012feee:
  run();
LAB_0012fef3:
  run();
LAB_0012fef8:
  run();
LAB_0012fefd:
  run();
LAB_0012ff02:
  run();
LAB_0012ff07:
  run();
LAB_0012ff0c:
  run();
LAB_0012ff11:
  run();
LAB_0012ff16:
  run();
LAB_0012ff1b:
  run();
LAB_0012ff20:
  run();
LAB_0012ff25:
  run();
LAB_0012ff2a:
  run();
LAB_0012ff2f:
  run();
LAB_0012ff34:
  run();
LAB_0012ff39:
  run();
LAB_0012ff3e:
  run();
LAB_0012ff43:
  run();
LAB_0012ff48:
  run();
LAB_0012ff4d:
  run();
LAB_0012ff52:
  run();
LAB_0012ff57:
  run();
LAB_0012ff5c:
  run();
LAB_0012ff61:
  run();
LAB_0012ff66:
  run();
LAB_0012ff6b:
  run();
LAB_0012ff70:
  run();
LAB_0012ff75:
  run();
LAB_0012ff7a:
  run();
LAB_0012ff7f:
  run();
LAB_0012ff84:
  run();
LAB_0012ff89:
  run();
LAB_0012ff8e:
  run();
LAB_0012ff93:
  run();
LAB_0012ff98:
  run();
LAB_0012ff9d:
  run();
LAB_0012ffa2:
  run();
LAB_0012ffa7:
  run();
LAB_0012ffac:
  run();
LAB_0012ffb1:
  run();
LAB_0012ffb6:
  run();
LAB_0012ffbb:
  run();
LAB_0012ffc0:
  run();
LAB_0012ffc5:
  run();
LAB_0012ffca:
  run();
LAB_0012ffcf:
  run();
LAB_0012ffd4:
  run();
LAB_0012ffd9:
  run();
LAB_0012ffde:
  run();
LAB_0012ffe3:
  run();
LAB_0012ffe8:
  run();
LAB_0012ffed:
  run();
LAB_0012fff2:
  run();
LAB_0012fff7:
  run();
LAB_0012fffc:
  run();
LAB_00130001:
  run();
LAB_00130006:
  run();
LAB_0013000b:
  run();
LAB_00130010:
  run();
LAB_00130015:
  run();
LAB_0013001a:
  run();
LAB_0013001f:
  run();
LAB_00130024:
  run();
LAB_00130029:
  run();
LAB_0013002e:
  run();
LAB_00130033:
  run();
LAB_00130038:
  run();
LAB_0013003d:
  run();
LAB_00130042:
  run();
LAB_00130047:
  run();
LAB_0013004c:
  run();
LAB_00130051:
  run();
LAB_00130056:
  run();
LAB_0013005b:
  run();
LAB_00130060:
  run();
LAB_00130065:
  run();
LAB_0013006a:
  run();
LAB_0013006f:
  run();
LAB_00130074:
  run();
LAB_00130079:
  run();
LAB_0013007e:
  run();
LAB_00130083:
  run();
LAB_00130088:
  run();
LAB_0013008d:
  run();
LAB_00130092:
  run();
LAB_00130097:
  run();
LAB_0013009c:
  run();
LAB_001300a1:
  run();
LAB_001300a6:
  run();
LAB_001300ab:
  run();
LAB_001300b0:
  run();
LAB_001300b5:
  run();
LAB_001300ba:
  run();
LAB_001300bf:
  run();
LAB_001300c4:
  run();
LAB_001300c9:
  run();
LAB_001300ce:
  run();
LAB_001300d3:
  run();
LAB_001300d8:
  run();
LAB_001300dd:
  run();
LAB_001300e2:
  DebugUtils::assertionFailed
            ("/workspace/llm4binary/github/license_all_cmakelists_25/hypeartist[P]asmjit-1/src/asmjit/x86/../x86/x86regalloc_p.h"
             ,0x161,"physId != Globals::kInvalidRegId");
}

Assistant:

Error X86CallAlloc::run(CCFuncCall* node) {
  // Initialize the allocator; prepare basics and connect Vd->Va.
  X86RAData* raData = node->getPassData<X86RAData>();
  init(node, raData);

  // Plan register allocation. Planner is only able to assign one register per
  // variable. If any variable is used multiple times it will be handled later.
  plan<X86Reg::kKindGp >();
  plan<X86Reg::kKindMm >();
  plan<X86Reg::kKindVec>();

  // Spill.
  spill<X86Reg::kKindGp >();
  spill<X86Reg::kKindMm >();
  spill<X86Reg::kKindVec>();

  // Alloc.
  alloc<X86Reg::kKindGp >();
  alloc<X86Reg::kKindMm >();
  alloc<X86Reg::kKindVec>();

  // Unuse clobbered registers that are not used to pass function arguments and
  // save variables used to pass function arguments that will be reused later on.
  save<X86Reg::kKindGp >();
  save<X86Reg::kKindMm >();
  save<X86Reg::kKindVec>();

  // Allocate immediates in registers and on the stack.
  allocImmsOnStack();

  // Duplicate.
  duplicate<X86Reg::kKindGp >();
  duplicate<X86Reg::kKindMm >();
  duplicate<X86Reg::kKindVec>();

  // Translate call operand.
  ASMJIT_PROPAGATE(X86RAPass_translateOperands(_context, node->getOpArray(), node->getOpCount()));

  // To emit instructions after call.
  _cc->_setCursor(node);

  // If the callee pops stack it has to be manually adjusted back.
  FuncDetail& fd = node->getDetail();
  if (fd.hasFlag(CallConv::kFlagCalleePopsStack) && fd.getArgStackSize() != 0)
    _cc->emit(X86Inst::kIdSub, _context->_zsp, static_cast<int>(fd.getArgStackSize()));

  // Clobber.
  clobber<X86Reg::kKindGp >();
  clobber<X86Reg::kKindMm >();
  clobber<X86Reg::kKindVec>();

  // Return.
  ret();

  // Unuse.
  unuseAfter<X86Reg::kKindGp >();
  unuseAfter<X86Reg::kKindMm >();
  unuseAfter<X86Reg::kKindVec>();

  // Cleanup; disconnect Vd->Va.
  cleanup();

  return kErrorOk;
}